

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O0

void __thiscall
ktxValidator::skipPadding(ktxValidator *this,validationContext *ctx,uint32_t alignment)

{
  ulong uVar1;
  int *piVar2;
  issue *in_stack_ffffffffffffff68;
  issue *in_stack_ffffffffffffff70;
  uint32_t in_stack_ffffffffffffff8c;
  validationContext *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  issue *in_stack_ffffffffffffffc0;
  severity in_stack_ffffffffffffffcc;
  ktxValidator *in_stack_ffffffffffffffd0;
  
  validationContext::skipPadding(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  uVar1 = std::ios::fail();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::ios::eof();
    if ((uVar1 & 1) != 0) {
      ::issue::issue((issue *)&stack0xffffffffffffff88,in_stack_ffffffffffffff68);
      addIssue<int>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
                    in_stack_ffffffffffffffbc);
      ::issue::~issue((issue *)0x114d15);
    }
  }
  else {
    ::issue::issue(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    piVar2 = __errno_location();
    strerror(*piVar2);
    addIssue<char*>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,
                    (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    ::issue::~issue((issue *)0x114ca1);
  }
  return;
}

Assistant:

void skipPadding(validationContext& ctx, uint32_t alignment) {
        ctx.skipPadding(alignment);
        if (ctx.inp->fail())
            addIssue(logger::eFatal, IOError.FileRead, strerror(errno));
        else if (ctx.inp->eof())
            addIssue(logger::eFatal, IOError.UnexpectedEOF, 0);
    }